

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O1

UniquePtr<SDL_Texture> * __thiscall
solitaire::graphics::SDLGraphicsSystemWithCreatedWindowTests::makeSDLTexture
          (UniquePtr<SDL_Texture> *__return_storage_ptr__,
          SDLGraphicsSystemWithCreatedWindowTests *this,SDL_Texture_conflict *ptr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  peVar1 = (this->super_SDLGraphicsSystemTests).ptrDeleterMock.
           super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (this->super_SDLGraphicsSystemTests).ptrDeleterMock.
           super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = peVar1;
  puVar3[1] = p_Var2;
  *(undefined8 *)
   &(__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false>._M_head_impl + 8) = 0;
  *(code **)((long)&(__return_storage_ptr__->_M_t).
                    super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
                    super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false>._M_head_impl +
            0x18) =
       std::_Function_handler<void_(SDL_Texture_*),_solitaire::SDL::PtrDeleter>::_M_invoke;
  *(undefined8 **)
   &(__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false>._M_head_impl = puVar3;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false>._M_head_impl + 8) = 0;
  *(code **)((long)&(__return_storage_ptr__->_M_t).
                    super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(SDL_Texture_*)>_>.
                    super__Head_base<1UL,_std::function<void_(SDL_Texture_*)>,_false>._M_head_impl +
            0x10) =
       std::_Function_handler<void_(SDL_Texture_*),_solitaire::SDL::PtrDeleter>::_M_manager;
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Texture_*,_std::function<void_(SDL_Texture_*)>_>.
  super__Head_base<0UL,_SDL_Texture_*,_false>._M_head_impl = ptr;
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Texture> makeSDLTexture(SDL_Texture* ptr) {
        return UniquePtr<SDL_Texture> {ptr, PtrDeleter {ptrDeleterMock}};
    }